

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_EnumReservedInvalidIdentifier_Test::
TestBody(ParseErrorTest_EnumReservedInvalidIdentifier_Test *this)

{
  ParserTest::ExpectHasWarnings
            (&this->super_ParseErrorTest,
             "\n        enum TestEnum {\n          FOO = 1;\n          reserved \"foo bar\";\n        }\n      "
             ,"3:19: Reserved name \"foo bar\" is not a valid identifier.\n");
  return;
}

Assistant:

TEST_F(ParseErrorTest, EnumReservedInvalidIdentifier) {
  ExpectHasWarnings(
      R"schema(
        enum TestEnum {
          FOO = 1;
          reserved "foo bar";
        }
      )schema",
      "3:19: Reserved name \"foo bar\" is not a valid identifier.\n");
}